

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::QuadFillTest::QuadFillTest
          (QuadFillTest *this,Context *context,char *name,char *description,
          WindowRectangle *viewport,Vec3 *d1,Vec3 *d2,Vec3 *center_)

{
  vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  *this_00;
  Vec4 e2;
  Vec4 e1;
  FillTriangle triangle2;
  FillTriangle triangle1;
  Vector<float,_4> VStack_138;
  tcu local_128 [8];
  float afStack_120 [2];
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  FillTriangle local_e8;
  undefined1 local_88 [24];
  undefined1 *puStack_70;
  float local_68 [2];
  float afStack_60 [2];
  undefined1 *local_58;
  undefined1 *puStack_50;
  float local_48 [2];
  float afStack_40 [2];
  undefined1 *local_38;
  undefined1 *puStack_30;
  
  TriangleFillTest::TriangleFillTest
            (&this->super_TriangleFillTest,context,name,description,viewport);
  (this->super_TriangleFillTest).super_FillTest.super_RenderTestCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TriangleFillTest_00c22180;
  local_118.m_data[2] = d1->m_data[2];
  local_118.m_data._0_8_ = *(undefined8 *)d1->m_data;
  local_118.m_data[3] = 1.0;
  local_88._0_8_ = *(undefined8 *)description;
  local_88._12_4_ = 0;
  local_88._8_4_ = *(uint *)(description + 8);
  tcu::operator*((tcu *)&local_f8,40000.0,(Vector<float,_4> *)local_88);
  local_88._0_4_ = (float)viewport->left;
  local_88._4_4_ = viewport->bottom;
  local_88._12_4_ = 0;
  local_88._8_4_ = viewport->width;
  tcu::operator*((tcu *)&local_108,40000.0,(Vector<float,_4> *)local_88);
  TriangleFillTest::FillTriangle::FillTriangle((FillTriangle *)local_88);
  TriangleFillTest::FillTriangle::FillTriangle(&local_e8);
  local_88._16_8_ = &DAT_3f0000003f000000;
  puStack_70 = &DAT_3f0000003f000000;
  local_58 = &DAT_3f0000003f000000;
  puStack_50 = &DAT_3f0000003f000000;
  local_38 = &DAT_3f0000003f000000;
  puStack_30 = &DAT_3f0000003f000000;
  tcu::operator+((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator+(local_128,&VStack_138,&local_108);
  local_88[0] = local_128[0];
  local_88[1] = local_128[1];
  local_88[2] = local_128[2];
  local_88[3] = local_128[3];
  local_88[4] = local_128[4];
  local_88[5] = local_128[5];
  local_88[6] = local_128[6];
  local_88[7] = local_128[7];
  local_88._8_4_ = afStack_120[0];
  local_88._12_4_ = afStack_120[1];
  tcu::operator+((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator-(local_128,&VStack_138,&local_108);
  local_68 = (float  [2])local_128;
  afStack_60[0] = afStack_120[0];
  afStack_60[1] = afStack_120[1];
  tcu::operator-((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator-(local_128,&VStack_138,&local_108);
  local_48 = (float  [2])local_128;
  afStack_40[0] = afStack_120[0];
  afStack_40[1] = afStack_120[1];
  this_00 = &(this->super_TriangleFillTest).m_triangles;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,(value_type *)local_88);
  local_e8.c0.m_data[0] = 0.5;
  local_e8.c0.m_data[1] = 0.0;
  local_e8.c0.m_data[2] = 0.0;
  local_e8.c0.m_data[3] = 0.5;
  local_e8.c1.m_data[0] = 0.5;
  local_e8.c1.m_data[1] = 0.0;
  local_e8.c1.m_data[2] = 0.0;
  local_e8.c1.m_data[3] = 0.5;
  local_e8.c2.m_data[0] = 0.5;
  local_e8.c2.m_data[1] = 0.0;
  local_e8.c2.m_data[2] = 0.0;
  local_e8.c2.m_data[3] = 0.5;
  tcu::operator+((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator+(local_128,&VStack_138,&local_108);
  local_e8.v0.m_data._0_8_ = local_128;
  local_e8.v0.m_data[2] = afStack_120[0];
  local_e8.v0.m_data[3] = afStack_120[1];
  tcu::operator-((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator-(local_128,&VStack_138,&local_108);
  local_e8.v1.m_data._0_8_ = local_128;
  local_e8.v1.m_data[2] = afStack_120[0];
  local_e8.v1.m_data[3] = afStack_120[1];
  tcu::operator-((tcu *)&VStack_138,&local_118,&local_f8);
  tcu::operator+(local_128,&VStack_138,&local_108);
  local_e8.v2.m_data._0_8_ = local_128;
  local_e8.v2.m_data[2] = afStack_120[0];
  local_e8.v2.m_data[3] = afStack_120[1];
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
  ::push_back(this_00,&local_e8);
  return;
}

Assistant:

QuadFillTest::QuadFillTest (Context& context, const char* name, const char* description, const rr::WindowRectangle& viewport, const tcu::Vec3& d1, const tcu::Vec3& d2, const tcu::Vec3& center_)
	: TriangleFillTest(context, name, description, viewport)
{
	const float		radius		= 40000.0f;
	const tcu::Vec4 center		= tcu::Vec4(center_.x(), center_.y(), center_.z(), 1.0f);
	const tcu::Vec4 halfWhite	= tcu::Vec4(0.5f, 0.5f, 0.5f, 0.5f);
	const tcu::Vec4 halfRed		= tcu::Vec4(0.5f, 0.0f, 0.0f, 0.5f);
	const tcu::Vec4	e1			= radius * tcu::Vec4(d1.x(), d1.y(), d1.z(), 0.0f);
	const tcu::Vec4	e2			= radius * tcu::Vec4(d2.x(), d2.y(), d2.z(), 0.0f);

	FillTriangle triangle1;
	FillTriangle triangle2;

	triangle1.c0 = halfWhite;
	triangle1.c1 = halfWhite;
	triangle1.c2 = halfWhite;
	triangle1.v0 = center + e1 + e2;
	triangle1.v1 = center + e1 - e2;
	triangle1.v2 = center - e1 - e2;
	m_triangles.push_back(triangle1);

	triangle2.c0 = halfRed;
	triangle2.c1 = halfRed;
	triangle2.c2 = halfRed;
	triangle2.v0 = center + e1 + e2;
	triangle2.v1 = center - e1 - e2;
	triangle2.v2 = center - e1 + e2;
	m_triangles.push_back(triangle2);
}